

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool m68k_tr_breakpoint_check(DisasContextBase_conflict1 *dcbase,CPUState *cpu,CPUBreakpoint *bp)

{
  gen_exception((DisasContext_conflict2 *)dcbase,dcbase->pc_next,0x10002);
  dcbase->pc_next = dcbase->pc_next + 2;
  return true;
}

Assistant:

static bool m68k_tr_breakpoint_check(DisasContextBase *dcbase, CPUState *cpu,
                                     const CPUBreakpoint *bp)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);

    gen_exception(dc, dc->base.pc_next, EXCP_DEBUG);
    /*
     * The address covered by the breakpoint must be included in
     * [tb->pc, tb->pc + tb->size) in order to for it to be
     * properly cleared -- thus we increment the PC here so that
     * the logic setting tb->size below does the right thing.
     */
    dc->base.pc_next += 2;

    return true;
}